

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiledata_unittest.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_347e::ProfileDataTest::ProfileDataTest(ProfileDataTest *this)

{
  ProfileDataTest *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ProfileDataTest_00197690;
  ProfileData::ProfileData(&this->collector_);
  ProfileDataChecker::ProfileDataChecker(&this->checker_);
  return;
}

Assistant:

void ExpectStopped() {
    EXPECT_FALSE(collector_.enabled());
  }